

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_debug.c
# Opt level: O1

char * lj_debug_uvnamev(cTValue *o,uint32_t idx,TValue **tvp,GCobj **op)

{
  char cVar1;
  TValue *pTVar2;
  bool bVar3;
  GCobj *pGVar4;
  uint uVar5;
  
  if ((o->field_4).it >> 0xf != 0x1fff7) {
    return (char *)0x0;
  }
  pGVar4 = (GCobj *)((ulong)o->field_4 & 0x7fffffffffff);
  if ((pGVar4->gch).unused1 == '\0') {
    pTVar2 = (pGVar4->th).base;
    uVar5 = (uint)*(byte *)((long)pTVar2 + -0x2c);
    bVar3 = idx < uVar5;
    if (uVar5 <= idx) goto LAB_001123e4;
    pGVar4 = *(GCobj **)((long)pGVar4 + (ulong)idx * 8 + 0x28);
    *tvp = (TValue *)(pGVar4->gch).metatable.gcptr64;
    *op = pGVar4;
    pGVar4 = (GCobj *)pTVar2[-2].u64;
    if (pGVar4 != (GCobj *)0x0) {
      if (idx != 0) {
        do {
          do {
            cVar1 = *(char *)pGVar4;
            pGVar4 = (GCobj *)((long)&(pGVar4->gch).nextgc.gcptr64 + 1);
          } while (cVar1 != '\0');
          idx = idx - 1;
        } while (idx != 0);
      }
      goto LAB_001123e4;
    }
  }
  else {
    if ((pGVar4->gch).unused2 <= idx) {
      bVar3 = false;
      goto LAB_001123e4;
    }
    *tvp = (TValue *)((long)pGVar4 + (ulong)idx * 8 + 0x30);
    *op = pGVar4;
    bVar3 = true;
  }
  pGVar4 = (GCobj *)0x15fca7;
LAB_001123e4:
  if (!bVar3) {
    return (char *)0x0;
  }
  return (char *)pGVar4;
}

Assistant:

const char *lj_debug_uvnamev(cTValue *o, uint32_t idx, TValue **tvp, GCobj **op)
{
  if (tvisfunc(o)) {
    GCfunc *fn = funcV(o);
    if (isluafunc(fn)) {
      GCproto *pt = funcproto(fn);
      if (idx < pt->sizeuv) {
	GCobj *uvo = gcref(fn->l.uvptr[idx]);
	*tvp = uvval(&uvo->uv);
	*op = uvo;
	return lj_debug_uvname(pt, idx);
      }
    } else {
      if (idx < fn->c.nupvalues) {
	*tvp = &fn->c.upvalue[idx];
	*op = obj2gco(fn);
	return "";
      }
    }
  }
  return NULL;
}